

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O1

void __thiscall
RVO::KdTree::buildAgentTreeRecursive(KdTree *this,size_t begin,size_t end,size_t node)

{
  float *pfVar1;
  long lVar2;
  pointer pAVar3;
  pointer ppAVar4;
  Agent *pAVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  size_t sVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  do {
    pAVar3 = (this->agentTree_).
             super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar3[node].begin = begin;
    pAVar3[node].end = end;
    ppAVar4 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pAVar5 = ppAVar4[begin];
    fVar11 = (pAVar5->position_).x_;
    pAVar3[node].maxX = fVar11;
    pAVar3[node].minX = fVar11;
    fVar11 = (pAVar5->position_).y_;
    pAVar3[node].maxY = fVar11;
    uVar7 = begin + 1;
    if (uVar7 < end) {
      fVar16 = pAVar3[node].minX;
      fVar14 = pAVar3[node].maxX;
      fVar17 = pAVar3[node].maxY;
      fVar13 = fVar11;
      do {
        pAVar5 = ppAVar4[uVar7];
        fVar12 = (pAVar5->position_).x_;
        fVar11 = (pAVar5->position_).y_;
        fVar15 = fVar12;
        if (fVar12 <= fVar14) {
          fVar15 = fVar14;
        }
        if (fVar16 <= fVar12) {
          fVar12 = fVar16;
        }
        fVar18 = fVar11;
        if (fVar11 <= fVar17) {
          fVar18 = fVar17;
        }
        if (fVar13 <= fVar11) {
          fVar11 = fVar13;
        }
        uVar7 = uVar7 + 1;
        fVar16 = fVar12;
        fVar14 = fVar15;
        fVar17 = fVar18;
        fVar13 = fVar11;
      } while (end != uVar7);
      pAVar3[node].maxX = fVar15;
      pAVar3[node].minX = fVar12;
      pAVar3[node].maxY = fVar18;
    }
    pAVar3[node].minY = fVar11;
    if (end - begin < 0xb) {
      return;
    }
    fVar13 = pAVar3[node].maxX - pAVar3[node].minX;
    fVar16 = pAVar3[node].maxY - pAVar3[node].minY;
    uVar10 = -(uint)(fVar16 < fVar13);
    fVar11 = (float)(~uVar10 & (uint)(pAVar3[node].maxY + pAVar3[node].minY) |
                    (uint)(pAVar3[node].maxX + pAVar3[node].minX) & uVar10) * 0.5;
    sVar9 = begin;
    if (begin < end) {
      lVar2 = (ulong)(fVar13 <= fVar16) * 4;
      uVar7 = end;
      do {
        uVar6 = sVar9;
        uVar8 = sVar9 + 1;
        if (sVar9 + 1 < uVar7) {
          uVar8 = uVar7;
        }
        do {
          pfVar1 = (float *)((long)&((this->agents_).
                                     super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar6]->position_).x_
                            + lVar2);
          sVar9 = uVar6;
          if (fVar11 < *pfVar1 || fVar11 == *pfVar1) break;
          uVar6 = uVar6 + 1;
          sVar9 = uVar8;
        } while (uVar8 != uVar6);
        if (sVar9 < uVar7) {
          uVar6 = uVar7;
          do {
            uVar6 = uVar6 - 1;
            if (*(float *)((long)&((this->agents_).
                                   super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar6]->position_).x_ +
                          lVar2) < fVar11) {
              ppAVar4 = (this->agents_).
                        super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pAVar5 = ppAVar4[sVar9];
              ppAVar4[sVar9] = ppAVar4[uVar6];
              ppAVar4[uVar6] = pAVar5;
              sVar9 = sVar9 + 1;
              uVar7 = uVar6;
              break;
            }
            uVar7 = sVar9;
          } while (sVar9 < uVar6);
        }
      } while (sVar9 < uVar7);
    }
    sVar9 = (sVar9 == begin) + sVar9;
    pAVar3 = (this->agentTree_).
             super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar3[node].left = node + 1;
    pAVar3[node].right = node + (sVar9 - begin) * 2;
    buildAgentTreeRecursive(this,begin,sVar9,node + 1);
    node = (this->agentTree_).
           super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
           ._M_impl.super__Vector_impl_data._M_start[node].right;
    begin = sVar9;
  } while( true );
}

Assistant:

void KdTree::buildAgentTreeRecursive(size_t begin, size_t end, size_t node)
	{
		agentTree_[node].begin = begin;
		agentTree_[node].end = end;
		agentTree_[node].minX = agentTree_[node].maxX = agents_[begin]->position_.x();
		agentTree_[node].minY = agentTree_[node].maxY = agents_[begin]->position_.y();

		for (size_t i = begin + 1; i < end; ++i) {
			agentTree_[node].maxX = std::max(agentTree_[node].maxX, agents_[i]->position_.x());
			agentTree_[node].minX = std::min(agentTree_[node].minX, agents_[i]->position_.x());
			agentTree_[node].maxY = std::max(agentTree_[node].maxY, agents_[i]->position_.y());
			agentTree_[node].minY = std::min(agentTree_[node].minY, agents_[i]->position_.y());
		}

		if (end - begin > MAX_LEAF_SIZE) {
			/* No leaf node. */
			const bool isVertical = (agentTree_[node].maxX - agentTree_[node].minX > agentTree_[node].maxY - agentTree_[node].minY);
			const float splitValue = (isVertical ? 0.5f * (agentTree_[node].maxX + agentTree_[node].minX) : 0.5f * (agentTree_[node].maxY + agentTree_[node].minY));

			size_t left = begin;
			size_t right = end;

			while (left < right) {
				while (left < right && (isVertical ? agents_[left]->position_.x() : agents_[left]->position_.y()) < splitValue) {
					++left;
				}

				while (right > left && (isVertical ? agents_[right - 1]->position_.x() : agents_[right - 1]->position_.y()) >= splitValue) {
					--right;
				}

				if (left < right) {
					std::swap(agents_[left], agents_[right - 1]);
					++left;
					--right;
				}
			}

			if (left == begin) {
				++left;
				++right;
			}

			agentTree_[node].left = node + 1;
			agentTree_[node].right = node + 2 * (left - begin);

			buildAgentTreeRecursive(begin, left, agentTree_[node].left);
			buildAgentTreeRecursive(left, end, agentTree_[node].right);
		}
	}